

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O1

int json_serialize_string(char *string,size_t len,char *buf)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  int iVar5;
  
  if (buf == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    buf[0] = '\"';
    buf[1] = '\0';
    pcVar4 = buf + 1;
  }
  if (len == 0) {
    iVar2 = 2;
  }
  else {
    iVar2 = 1;
    sVar3 = 0;
    do {
      cVar1 = string[sVar3];
      switch(cVar1) {
      case '\0':
        iVar5 = 6;
        if (pcVar4 == (char *)0x0) break;
        pcVar4[4] = '0';
        pcVar4[5] = '0';
LAB_0018f19b:
        iVar5 = 6;
        builtin_strncpy(pcVar4,"\\u00",4);
        pcVar4[6] = '\0';
        pcVar4 = pcVar4 + 6;
        goto LAB_0018f1c2;
      case '\x01':
        iVar5 = 6;
        if (pcVar4 != (char *)0x0) {
          pcVar4[4] = '0';
          pcVar4[5] = '1';
          goto LAB_0018f19b;
        }
        break;
      case '\x02':
        iVar5 = 6;
        if (pcVar4 != (char *)0x0) {
          pcVar4[4] = '0';
          pcVar4[5] = '2';
          goto LAB_0018f19b;
        }
        break;
      case '\x03':
        iVar5 = 6;
        if (pcVar4 != (char *)0x0) {
          pcVar4[4] = '0';
          pcVar4[5] = '3';
          goto LAB_0018f19b;
        }
        break;
      case '\x04':
        iVar5 = 6;
        if (pcVar4 != (char *)0x0) {
          pcVar4[4] = '0';
          pcVar4[5] = '4';
          goto LAB_0018f19b;
        }
        break;
      case '\x05':
        iVar5 = 6;
        if (pcVar4 != (char *)0x0) {
          pcVar4[4] = '0';
          pcVar4[5] = '5';
          goto LAB_0018f19b;
        }
        break;
      case '\x06':
        iVar5 = 6;
        if (pcVar4 != (char *)0x0) {
          pcVar4[4] = '0';
          pcVar4[5] = '6';
          goto LAB_0018f19b;
        }
        break;
      case '\a':
        iVar5 = 6;
        if (pcVar4 != (char *)0x0) {
          pcVar4[4] = '0';
          pcVar4[5] = '7';
          goto LAB_0018f19b;
        }
        break;
      case '\b':
        iVar5 = 2;
        if (pcVar4 != (char *)0x0) {
          pcVar4[0] = '\\';
          pcVar4[1] = 'b';
LAB_0018f0e9:
          iVar5 = 2;
          pcVar4[2] = '\0';
          pcVar4 = pcVar4 + 2;
          goto LAB_0018f1c2;
        }
        break;
      case '\t':
        iVar5 = 2;
        if (pcVar4 != (char *)0x0) {
          pcVar4[0] = '\\';
          pcVar4[1] = 't';
          goto LAB_0018f0e9;
        }
        break;
      case '\n':
        iVar5 = 2;
        if (pcVar4 != (char *)0x0) {
          pcVar4[0] = '\\';
          pcVar4[1] = 'n';
          goto LAB_0018f0e9;
        }
        break;
      case '\v':
        iVar5 = 6;
        if (pcVar4 != (char *)0x0) {
          pcVar4[4] = '0';
          pcVar4[5] = 'b';
          goto LAB_0018f19b;
        }
        break;
      case '\f':
        iVar5 = 2;
        if (pcVar4 != (char *)0x0) {
          pcVar4[0] = '\\';
          pcVar4[1] = 'f';
          goto LAB_0018f0e9;
        }
        break;
      case '\r':
        iVar5 = 2;
        if (pcVar4 != (char *)0x0) {
          pcVar4[0] = '\\';
          pcVar4[1] = 'r';
          goto LAB_0018f0e9;
        }
        break;
      case '\x0e':
        iVar5 = 6;
        if (pcVar4 != (char *)0x0) {
          pcVar4[4] = '0';
          pcVar4[5] = 'e';
          goto LAB_0018f19b;
        }
        break;
      case '\x0f':
        iVar5 = 6;
        if (pcVar4 != (char *)0x0) {
          pcVar4[4] = '0';
          pcVar4[5] = 'f';
          goto LAB_0018f19b;
        }
        break;
      case '\x10':
        iVar5 = 6;
        if (pcVar4 != (char *)0x0) {
          pcVar4[4] = '1';
          pcVar4[5] = '0';
          goto LAB_0018f19b;
        }
        break;
      case '\x11':
        iVar5 = 6;
        if (pcVar4 != (char *)0x0) {
          pcVar4[4] = '1';
          pcVar4[5] = '1';
          goto LAB_0018f19b;
        }
        break;
      case '\x12':
        iVar5 = 6;
        if (pcVar4 != (char *)0x0) {
          pcVar4[4] = '1';
          pcVar4[5] = '2';
          goto LAB_0018f19b;
        }
        break;
      case '\x13':
        iVar5 = 6;
        if (pcVar4 != (char *)0x0) {
          pcVar4[4] = '1';
          pcVar4[5] = '3';
          goto LAB_0018f19b;
        }
        break;
      case '\x14':
        iVar5 = 6;
        if (pcVar4 != (char *)0x0) {
          pcVar4[4] = '1';
          pcVar4[5] = '4';
          goto LAB_0018f19b;
        }
        break;
      case '\x15':
        iVar5 = 6;
        if (pcVar4 != (char *)0x0) {
          pcVar4[4] = '1';
          pcVar4[5] = '5';
          goto LAB_0018f19b;
        }
        break;
      case '\x16':
        iVar5 = 6;
        if (pcVar4 != (char *)0x0) {
          pcVar4[4] = '1';
          pcVar4[5] = '6';
          goto LAB_0018f19b;
        }
        break;
      case '\x17':
        iVar5 = 6;
        if (pcVar4 != (char *)0x0) {
          pcVar4[4] = '1';
          pcVar4[5] = '7';
          goto LAB_0018f19b;
        }
        break;
      case '\x18':
        iVar5 = 6;
        if (pcVar4 != (char *)0x0) {
          pcVar4[4] = '1';
          pcVar4[5] = '8';
          goto LAB_0018f19b;
        }
        break;
      case '\x19':
        iVar5 = 6;
        if (pcVar4 != (char *)0x0) {
          pcVar4[4] = '1';
          pcVar4[5] = '9';
          goto LAB_0018f19b;
        }
        break;
      case '\x1a':
        iVar5 = 6;
        if (pcVar4 != (char *)0x0) {
          pcVar4[4] = '1';
          pcVar4[5] = 'a';
          goto LAB_0018f19b;
        }
        break;
      case '\x1b':
        iVar5 = 6;
        if (pcVar4 != (char *)0x0) {
          pcVar4[4] = '1';
          pcVar4[5] = 'b';
          goto LAB_0018f19b;
        }
        break;
      case '\x1c':
        iVar5 = 6;
        if (pcVar4 != (char *)0x0) {
          pcVar4[4] = '1';
          pcVar4[5] = 'c';
          goto LAB_0018f19b;
        }
        break;
      case '\x1d':
        iVar5 = 6;
        if (pcVar4 != (char *)0x0) {
          pcVar4[4] = '1';
          pcVar4[5] = 'd';
          goto LAB_0018f19b;
        }
        break;
      case '\x1e':
        iVar5 = 6;
        if (pcVar4 != (char *)0x0) {
          pcVar4[4] = '1';
          pcVar4[5] = 'e';
          goto LAB_0018f19b;
        }
        break;
      case '\x1f':
        iVar5 = 6;
        if (pcVar4 != (char *)0x0) {
          pcVar4[4] = '1';
          pcVar4[5] = 'f';
          goto LAB_0018f19b;
        }
        break;
      case ' ':
      case '!':
      case '#':
      case '$':
      case '%':
      case '&':
      case '\'':
      case '(':
      case ')':
      case '*':
      case '+':
      case ',':
      case '-':
      case '.':
switchD_0018ee11_caseD_20:
        iVar5 = 1;
        if (pcVar4 != (char *)0x0) {
          *pcVar4 = cVar1;
LAB_0018f1bb:
          iVar5 = 1;
          pcVar4 = pcVar4 + 1;
          goto LAB_0018f1c2;
        }
        break;
      case '\"':
        iVar5 = 2;
        if (pcVar4 != (char *)0x0) {
          pcVar4[0] = '\\';
          pcVar4[1] = '\"';
          goto LAB_0018f0e9;
        }
        break;
      case '/':
        if (parson_escape_slashes == 0) {
          iVar5 = 1;
          if (pcVar4 == (char *)0x0) break;
          pcVar4[0] = '/';
          pcVar4[1] = '\0';
          goto LAB_0018f1bb;
        }
        iVar5 = 2;
        if (pcVar4 != (char *)0x0) {
          pcVar4[0] = '\\';
          pcVar4[1] = '/';
          goto LAB_0018f0e9;
        }
        break;
      default:
        if (cVar1 != '\\') goto switchD_0018ee11_caseD_20;
        iVar5 = 2;
        if (pcVar4 != (char *)0x0) {
          pcVar4[0] = '\\';
          pcVar4[1] = '\\';
          goto LAB_0018f0e9;
        }
      }
      pcVar4 = (char *)0x0;
LAB_0018f1c2:
      iVar2 = iVar2 + iVar5;
      sVar3 = sVar3 + 1;
    } while (len != sVar3);
    iVar2 = iVar2 + 1;
  }
  if (pcVar4 != (char *)0x0) {
    pcVar4[0] = '\"';
    pcVar4[1] = '\0';
  }
  return iVar2;
}

Assistant:

static int json_serialize_string(const char *string, size_t len, char *buf) {
    size_t i = 0;
    char c = '\0';
    int written = -1, written_total = 0;
    APPEND_STRING("\"");
    for (i = 0; i < len; i++) {
        c = string[i];
        switch (c) {
            case '\"': APPEND_STRING("\\\""); break;
            case '\\': APPEND_STRING("\\\\"); break;
            case '\b': APPEND_STRING("\\b"); break;
            case '\f': APPEND_STRING("\\f"); break;
            case '\n': APPEND_STRING("\\n"); break;
            case '\r': APPEND_STRING("\\r"); break;
            case '\t': APPEND_STRING("\\t"); break;
            case '\x00': APPEND_STRING("\\u0000"); break;
            case '\x01': APPEND_STRING("\\u0001"); break;
            case '\x02': APPEND_STRING("\\u0002"); break;
            case '\x03': APPEND_STRING("\\u0003"); break;
            case '\x04': APPEND_STRING("\\u0004"); break;
            case '\x05': APPEND_STRING("\\u0005"); break;
            case '\x06': APPEND_STRING("\\u0006"); break;
            case '\x07': APPEND_STRING("\\u0007"); break;
            /* '\x08' duplicate: '\b' */
            /* '\x09' duplicate: '\t' */
            /* '\x0a' duplicate: '\n' */
            case '\x0b': APPEND_STRING("\\u000b"); break;
            /* '\x0c' duplicate: '\f' */
            /* '\x0d' duplicate: '\r' */
            case '\x0e': APPEND_STRING("\\u000e"); break;
            case '\x0f': APPEND_STRING("\\u000f"); break;
            case '\x10': APPEND_STRING("\\u0010"); break;
            case '\x11': APPEND_STRING("\\u0011"); break;
            case '\x12': APPEND_STRING("\\u0012"); break;
            case '\x13': APPEND_STRING("\\u0013"); break;
            case '\x14': APPEND_STRING("\\u0014"); break;
            case '\x15': APPEND_STRING("\\u0015"); break;
            case '\x16': APPEND_STRING("\\u0016"); break;
            case '\x17': APPEND_STRING("\\u0017"); break;
            case '\x18': APPEND_STRING("\\u0018"); break;
            case '\x19': APPEND_STRING("\\u0019"); break;
            case '\x1a': APPEND_STRING("\\u001a"); break;
            case '\x1b': APPEND_STRING("\\u001b"); break;
            case '\x1c': APPEND_STRING("\\u001c"); break;
            case '\x1d': APPEND_STRING("\\u001d"); break;
            case '\x1e': APPEND_STRING("\\u001e"); break;
            case '\x1f': APPEND_STRING("\\u001f"); break;
            case '/':
                if (parson_escape_slashes) {
                    APPEND_STRING("\\/");  /* to make json embeddable in xml\/html */
                } else {
                    APPEND_STRING("/");
                }
                break;
            default:
                if (buf != NULL) {
                    buf[0] = c;
                    buf += 1;
                }
                written_total += 1;
                break;
        }
    }
    APPEND_STRING("\"");
    return written_total;
}